

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O2

void Nf_ManPrepareGate(int nVars,word uTruth,int *pComp,int *pPerm,Vec_Wrd_t *vResult)

{
  int iVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  word *__ptr;
  ulong uVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  
  uVar4 = Extra_Factorial(nVars);
  bVar2 = (byte)nVars & 0x1f;
  vResult->nSize = 0;
  iVar9 = 0;
  uVar3 = 1 << bVar2;
  if (1 << bVar2 < 1) {
    uVar3 = 0;
  }
  uVar5 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar5 = 0;
  }
  lVar7 = 0;
  do {
    if (lVar7 == 2) {
      return;
    }
    uVar10 = -lVar7;
    uVar11 = uVar10 ^ uTruth;
    for (uVar13 = 0; uVar13 != uVar5; uVar13 = uVar13 + 1) {
      uVar6 = uVar11;
      for (uVar12 = 0; uVar3 != uVar12; uVar12 = uVar12 + 1) {
        if (iVar9 == vResult->nCap) {
          uVar4 = iVar9 * 2;
          if (iVar9 < 0x10) {
            uVar4 = 0x10;
          }
          __ptr = vResult->pArray;
          if (iVar9 < (int)uVar4) {
            if (__ptr == (word *)0x0) {
              __ptr = (word *)malloc((ulong)uVar4 << 3);
            }
            else {
              __ptr = (word *)realloc(__ptr,(ulong)uVar4 << 3);
            }
            vResult->pArray = __ptr;
            if (__ptr == (word *)0x0) {
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                            ,0x205,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
            }
            vResult->nCap = uVar4;
            iVar9 = vResult->nSize;
          }
        }
        else {
          __ptr = vResult->pArray;
        }
        lVar8 = (long)iVar9;
        iVar9 = iVar9 + 1;
        vResult->nSize = iVar9;
        __ptr[lVar8] = uVar6;
        bVar2 = (byte)(1L << ((byte)pComp[uVar12] & 0x3f));
        uVar6 = (s_Truths6[pComp[uVar12]] & uVar6) >> (bVar2 & 0x3f) |
                uVar6 << (bVar2 & 0x3f) & s_Truths6[pComp[uVar12]];
      }
      if (uVar11 != uVar6) {
        __assert_fail("tTemp2 == tCur",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mio/mioUtils.c"
                      ,0x54b,"void Nf_ManPrepareGate(int, word, int *, int *, Vec_Wrd_t *)");
      }
      iVar1 = pPerm[uVar13];
      bVar2 = (byte)(1L << ((byte)iVar1 & 0x3f));
      uVar11 = (uVar11 & s_PMasks[iVar1][2]) >> (bVar2 & 0x3f) |
               (s_PMasks[iVar1][1] & uVar11) << (bVar2 & 0x3f) | s_PMasks[iVar1][0] & uVar11;
    }
    lVar7 = lVar7 + 1;
    if ((uVar10 ^ uTruth) != uVar11) {
      __assert_fail("tTemp1 == tCur",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mio/mioUtils.c"
                    ,0x54e,"void Nf_ManPrepareGate(int, word, int *, int *, Vec_Wrd_t *)");
    }
  } while( true );
}

Assistant:

void Nf_ManPrepareGate( int nVars, word uTruth, int * pComp, int * pPerm, Vec_Wrd_t * vResult )
{
    int nPerms = Extra_Factorial( nVars );
    int nMints = (1 << nVars);
    word tCur, tTemp1, tTemp2;
    int i, p, c;
    Vec_WrdClear( vResult );
    for ( i = 0; i < 2; i++ )
    {
        tCur = i ? ~uTruth : uTruth;
        tTemp1 = tCur;
        for ( p = 0; p < nPerms; p++ )
        {
            tTemp2 = tCur;
            for ( c = 0; c < nMints; c++ )
            {
                Vec_WrdPush( vResult, tCur );
                tCur = Abc_Tt6Flip( tCur, pComp[c] );
            }
            assert( tTemp2 == tCur );
            tCur = Abc_Tt6SwapAdjacent( tCur, pPerm[p] );
        }
        assert( tTemp1 == tCur );
    }
}